

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dic_compiler.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 *in_RSI;
  int in_EDI;
  bool bVar4;
  size_t tabs;
  size_t size;
  char text [4096];
  char local_1018 [72];
  char *in_stack_fffffffffffff030;
  daciuk<29> *in_stack_fffffffffffff038;
  uint in_stack_fffffffffffff3dc;
  char *in_stack_fffffffffffff3e0;
  int local_4;
  
  if (in_EDI < 2) {
    fprintf(_stderr,"Usage: %s dictionary.dic\n",*in_RSI);
    local_4 = -1;
  }
  else {
    while( true ) {
      iVar1 = feof(_stdin);
      bVar4 = false;
      if (iVar1 == 0) {
        iVar1 = ferror(_stdin);
        bVar4 = iVar1 == 0;
      }
      if ((!bVar4) || (pcVar2 = fgets(local_1018,0x1000,_stdin), pcVar2 == (char *)0x0)) break;
      sVar3 = strcspn(local_1018,"\r\n");
      local_1018[sVar3] = '\0';
      sVar3 = strcspn(local_1018,"\t");
      local_1018[sVar3] = '\0';
      strtoul(local_1018 + sVar3 + 1,(char **)0x0,10);
      dic_insert_word(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3dc);
    }
    MAFSA::daciuk<29>::save_to_file(in_stack_fffffffffffff038,in_stack_fffffffffffff030);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
	if (2 > argc)
	{
		fprintf(stderr, "Usage: %s dictionary.dic\n", argv[0]);
		return -1;
	}

	while (!feof(stdin) && !ferror(stdin))
	{
		char text [4096];
		size_t size, tabs;

		if (NULL == fgets(text, 4096, stdin))
		{
			break;
		}

		size = strcspn(text, "\r\n");
		text[size] = 0;

		tabs = strcspn(text, "\t");
		text[tabs] = 0;

		dic_insert_word(text, strtoul(text + tabs + 1, NULL, 10));
	}

	dict.save_to_file(argv[1]);

	return 0;
}